

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.c
# Opt level: O0

void NOPL3_WriteRegBuffered(opl3_chip *chip,uint16_t reg,uint8_t v)

{
  uint uVar1;
  opl3_writebuf *poVar2;
  uint32_t writebuf_last;
  opl3_writebuf *writebuf;
  uint64_t time2;
  uint64_t time1;
  uint8_t v_local;
  uint16_t reg_local;
  opl3_chip *chip_local;
  
  uVar1 = chip->writebuf_last;
  poVar2 = chip->writebuf + uVar1;
  if ((poVar2->reg & 0x200) != 0) {
    NOPL3_WriteReg(chip,poVar2->reg & 0x1ff,poVar2->data);
    chip->writebuf_cur = uVar1 + 1 & 0x3ff;
    chip->writebuf_samplecnt = poVar2->time;
  }
  poVar2->reg = reg | 0x200;
  poVar2->data = v;
  time2 = chip->writebuf_lasttime + 2;
  if (time2 < chip->writebuf_samplecnt) {
    time2 = chip->writebuf_samplecnt;
  }
  poVar2->time = time2;
  chip->writebuf_lasttime = time2;
  chip->writebuf_last = uVar1 + 1 & 0x3ff;
  return;
}

Assistant:

void NOPL3_WriteRegBuffered(opl3_chip *chip, uint16_t reg, uint8_t v)
{
#ifdef NOPL_ENABLE_WRITEBUF
    uint64_t time1, time2;
    opl3_writebuf *writebuf;
    uint32_t writebuf_last;

    writebuf_last = chip->writebuf_last;
    writebuf = &chip->writebuf[writebuf_last];

    if (writebuf->reg & 0x200)
    {
        NOPL3_WriteReg(chip, writebuf->reg & 0x1ff, writebuf->data);

        chip->writebuf_cur = (writebuf_last + 1) % OPL_WRITEBUF_SIZE;
        chip->writebuf_samplecnt = writebuf->time;
    }

    writebuf->reg = reg | 0x200;
    writebuf->data = v;
    time1 = chip->writebuf_lasttime + OPL_WRITEBUF_DELAY;
    time2 = chip->writebuf_samplecnt;

    if (time1 < time2)
    {
        time1 = time2;
    }

    writebuf->time = time1;
    chip->writebuf_lasttime = time1;
    chip->writebuf_last = (writebuf_last + 1) % OPL_WRITEBUF_SIZE;
#else
    NOPL3_WriteReg(chip, reg, v);
#endif
}